

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O1

void statfs_cb(uv_fs_t *req)

{
  long *plVar1;
  int iVar2;
  uv_fs_t *puVar3;
  
  if (req->fs_type == UV_FS_STATFS) {
    puVar3 = req;
    if (req->result != 0) goto LAB_0015a0dd;
    plVar1 = (long *)req->ptr;
    if (plVar1 == (long *)0x0) goto LAB_0015a0e2;
    if (*plVar1 == 0) goto LAB_0015a0e7;
    if (plVar1[1] == 0) goto LAB_0015a0ec;
    if (plVar1[2] == 0) goto LAB_0015a0f1;
    if ((ulong)plVar1[2] < (ulong)plVar1[3]) goto LAB_0015a0f6;
    if ((ulong)plVar1[3] < (ulong)plVar1[4]) goto LAB_0015a0fb;
    if ((ulong)plVar1[6] <= (ulong)plVar1[5]) {
      uv_fs_req_cleanup(req);
      if (req->ptr == (void *)0x0) {
        statfs_cb_count = statfs_cb_count + 1;
        return;
      }
      goto LAB_0015a105;
    }
  }
  else {
    statfs_cb_cold_1();
    puVar3 = req;
LAB_0015a0dd:
    statfs_cb_cold_2();
LAB_0015a0e2:
    statfs_cb_cold_10();
LAB_0015a0e7:
    statfs_cb_cold_9();
LAB_0015a0ec:
    statfs_cb_cold_8();
LAB_0015a0f1:
    statfs_cb_cold_7();
LAB_0015a0f6:
    statfs_cb_cold_6();
LAB_0015a0fb:
    statfs_cb_cold_5();
  }
  statfs_cb_cold_4();
LAB_0015a105:
  statfs_cb_cold_3();
  iVar2 = uv_is_closing();
  if (iVar2 != 0) {
    return;
  }
  uv_close(puVar3,0);
  return;
}

Assistant:

static void statfs_cb(uv_fs_t* req) {
  uv_statfs_t* stats;

  ASSERT(req->fs_type == UV_FS_STATFS);
  ASSERT(req->result == 0);
  ASSERT(req->ptr != NULL);
  stats = req->ptr;

#if defined(_WIN32) || defined(__sun) || defined(_AIX) || defined(__MVS__) || \
  defined(__OpenBSD__) || defined(__NetBSD__)
  ASSERT(stats->f_type == 0);
#else
  ASSERT(stats->f_type > 0);
#endif

  ASSERT(stats->f_bsize > 0);
  ASSERT(stats->f_blocks > 0);
  ASSERT(stats->f_bfree <= stats->f_blocks);
  ASSERT(stats->f_bavail <= stats->f_bfree);

#ifdef _WIN32
  ASSERT(stats->f_files == 0);
  ASSERT(stats->f_ffree == 0);
#else
  /* There is no assertion for stats->f_files that makes sense, so ignore it. */
  ASSERT(stats->f_ffree <= stats->f_files);
#endif
  uv_fs_req_cleanup(req);
  ASSERT(req->ptr == NULL);
  statfs_cb_count++;
}